

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormatString.hpp
# Opt level: O0

void Diligent::
     FormatStrSS<std::__cxx11::stringstream,char[13],unsigned_int,char[29],char_const*,char[52],unsigned_int,char[2]>
               (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *ss,
               char (*FirstArg) [13],uint *RestArgs,char (*RestArgs_1) [29],char **RestArgs_2,
               char (*RestArgs_3) [52],uint *RestArgs_4,char (*RestArgs_5) [2])

{
  char (*RestArgs_local_3) [52];
  char **RestArgs_local_2;
  char (*RestArgs_local_1) [29];
  uint *RestArgs_local;
  char (*FirstArg_local) [13];
  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *ss_local;
  
  FormatStrSS<std::__cxx11::stringstream,char[13]>(ss,FirstArg);
  FormatStrSS<std::__cxx11::stringstream,unsigned_int,char[29],char_const*,char[52],unsigned_int,char[2]>
            (ss,RestArgs,RestArgs_1,RestArgs_2,RestArgs_3,RestArgs_4,RestArgs_5);
  return;
}

Assistant:

void FormatStrSS(SSType& ss, const FirstArgType& FirstArg, const RestArgsType&... RestArgs)
{
    FormatStrSS(ss, FirstArg);
    FormatStrSS(ss, RestArgs...); // recursive call using pack expansion syntax
}